

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buildvm_lib.c
# Opt level: O3

void libdef_func(BuildCtx *ctx,char *p,int arg)

{
  uint8_t *puVar1;
  int iVar2;
  int extraout_EAX;
  int iVar3;
  size_t sVar4;
  char cVar5;
  uint uVar6;
  ulong uVar7;
  char *pcVar8;
  char **ppcVar9;
  FILE *pFVar10;
  long lVar11;
  
  ppcVar9 = (char **)(ulong)(uint)arg;
  if (arg != 0) {
    ffasmfunc = ffasmfunc + 1;
  }
  iVar3 = ctx->mode - BUILD_ffdef;
  switch(iVar3) {
  case 0:
    pFVar10 = (FILE *)ctx->fp;
    pcVar8 = "FFDEF(%s)\n";
    break;
  case 1:
    if (modstate != 0) {
      iVar3 = modstate;
      uVar6 = regfunc;
      if (regfunc == 1) {
        if (optr + 1 < (uint8_t *)((long)&optr + 1U)) {
          puVar1 = optr + 1;
          *optr = 0xfe;
          optr = puVar1;
          goto LAB_0010b901;
        }
        goto LAB_0010ba72;
      }
      goto LAB_0010b9bd;
    }
    goto LAB_0010ba6a;
  case 2:
    sVar4 = strlen(p);
    if (sVar4 < 0x50) {
      strcpy(funcname,p);
      goto LAB_0010b901;
    }
    libdef_func_cold_1();
LAB_0010ba6a:
    libdef_func_cold_3();
LAB_0010ba72:
    libdef_func_cold_2();
  case 3:
    cVar5 = p[1];
    if (cVar5 != '\0') {
      lVar11 = 0;
      do {
        if (modname[lVar11] == '\0') break;
        if (cVar5 == '_') {
          p[lVar11 + 1] = '.';
        }
        cVar5 = p[lVar11 + 2];
        lVar11 = lVar11 + 1;
      } while (cVar5 != '\0');
    }
    pFVar10 = (FILE *)ctx->fp;
    pcVar8 = "\"%s\",\n";
    break;
  default:
    uVar6 = CONCAT31((int3)((uint)iVar3 >> 8),arg == 0);
    uVar7 = (ulong)uVar6;
    if (ctx->mode != BUILD_bcdef || arg == 0) goto LAB_0010b901;
    iVar3 = ctx->nglob;
    if (0 < (long)iVar3) {
      pFVar10 = (FILE *)ctx->fp;
      ppcVar9 = ctx->globnames;
      lVar11 = 0;
      do {
        pcVar8 = ppcVar9[lVar11];
        if ((((*pcVar8 == 'f') && (pcVar8[1] == 'f')) && (pcVar8[2] == '_')) &&
           (iVar2 = strcmp(pcVar8 + 3,p), iVar2 == 0)) {
          fprintf(pFVar10,",\n%d",(ulong)(uint)(*(int *)(ctx->glob + lVar11) - *(int *)&ctx->code));
          goto LAB_0010b901;
        }
        uVar6 = (uint)uVar7;
        lVar11 = lVar11 + 1;
      } while (iVar3 != lVar11);
    }
    arg = (int)ppcVar9;
    libdef_func_cold_4();
    iVar3 = extraout_EAX;
LAB_0010b9bd:
    if (arg != 0x80) {
      if (iVar3 != 1) {
        fwrite(",\n",2,1,(FILE *)ctx->fp);
      }
      modstate = 2;
      pcVar8 = "lj_cf_";
      if (arg != 0) {
        pcVar8 = "lj_ffh_";
      }
      fprintf((FILE *)ctx->fp,"  %s%s",pcVar8,p);
      uVar6 = regfunc;
    }
    if (uVar6 == 2) {
      p = "";
    }
    else {
      obuf[2] = obuf[2] + '\x01';
    }
    libdef_name(p,arg);
    goto LAB_0010b901;
  }
  fprintf(pFVar10,pcVar8,p);
LAB_0010b901:
  ffid = ffid + 1;
  regfunc = 0;
  return;
}

Assistant:

static void libdef_func(BuildCtx *ctx, char *p, int arg)
{
  if (arg != LIBINIT_CF)
    ffasmfunc++;
  if (ctx->mode == BUILD_libdef) {
    if (modstate == 0) {
      fprintf(stderr, "Error: no module for function definition %s\n", p);
      exit(1);
    }
    if (regfunc == REGFUNC_NOREG) {
      if (optr+1 > obuf+sizeof(obuf)) {
	fprintf(stderr, "Error: output buffer overflow\n");
	exit(1);
      }
      *optr++ = LIBINIT_FFID;
    } else {
      if (arg != LIBINIT_ASM_) {
	if (modstate != 1) fprintf(ctx->fp, ",\n");
	modstate = 2;
	fprintf(ctx->fp, "  %s%s", arg ? LABEL_PREFIX_FFH : LABEL_PREFIX_CF, p);
      }
      if (regfunc != REGFUNC_NOREGUV) obuf[2]++;  /* Bump hash table size. */
      libdef_name(regfunc == REGFUNC_NOREGUV ? "" : p, arg);
    }
  } else if (ctx->mode == BUILD_ffdef) {
    fprintf(ctx->fp, "FFDEF(%s)\n", p);
  } else if (ctx->mode == BUILD_recdef) {
    if (strlen(p) > sizeof(funcname)-1) {
      fprintf(stderr, "Error: function name too long: '%s'\n", p);
      exit(1);
    }
    strcpy(funcname, p);
  } else if (ctx->mode == BUILD_vmdef) {
    int i;
    for (i = 1; p[i] && modname[i-1]; i++)
      if (p[i] == '_') p[i] = '.';
    fprintf(ctx->fp, "\"%s\",\n", p);
  } else if (ctx->mode == BUILD_bcdef) {
    if (arg != LIBINIT_CF)
      fprintf(ctx->fp, ",\n%d", find_ffofs(ctx, p));
  }
  ffid++;
  regfunc = REGFUNC_OK;
}